

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O1

void dill_assoc_client_data(dill_exec_ctx ec,int key,long value)

{
  int iVar1;
  intptr_t *piVar2;
  client_data_struct *pcVar3;
  long lVar4;
  long lVar5;
  
  lVar5 = (long)ec->client_data_count;
  if (0 < lVar5) {
    piVar2 = &ec->client_data->value;
    lVar4 = lVar5;
    do {
      if (((client_data_struct *)(piVar2 + -1))->key == key) goto LAB_00110e6c;
      piVar2 = piVar2 + 2;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  if (ec->client_data_count == 0) {
    pcVar3 = (client_data_struct *)dill_malloc(0x10);
  }
  else {
    pcVar3 = (client_data_struct *)dill_realloc(ec->client_data,lVar5 * 0x10 + 0x10);
  }
  ec->client_data = pcVar3;
  iVar1 = ec->client_data_count;
  piVar2 = &ec->client_data[iVar1].value;
  ec->client_data[iVar1].key = key;
  ec->client_data_count = iVar1 + 1;
LAB_00110e6c:
  *piVar2 = value;
  return;
}

Assistant:

extern void
dill_assoc_client_data(dill_exec_ctx ec, int key, IMM_TYPE value)
{
    int i = 0;
    for (i = 0; i < ec->client_data_count; i++) {
        if (ec->client_data[i].key == key) {
            ec->client_data[i].value = value;
            return;
        }
    }
    if (ec->client_data_count == 0) {
        ec->client_data = malloc(sizeof(struct client_data_struct));
    } else {
        ec->client_data =
            realloc(ec->client_data, sizeof(struct client_data_struct) *
                                         (ec->client_data_count + 1));
    }
    ec->client_data[ec->client_data_count].key = key;
    ec->client_data[ec->client_data_count++].value = value;
}